

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O3

ostream * deqp::gles31::Functional::operator<<(ostream *str,VarValue *varValue)

{
  DataType dataType;
  DataType DVar1;
  uint uVar2;
  char *__s;
  size_t sVar3;
  ulong uVar4;
  Hex<8UL> local_40;
  uint local_34;
  
  dataType = (varValue->type->m_data).basic.type;
  DVar1 = glu::getDataTypeScalarType(dataType);
  uVar2 = glu::getDataTypeScalarSize(dataType);
  if ((int)uVar2 < 2) {
    if (uVar2 != 1) {
      return str;
    }
  }
  else {
    __s = glu::getDataTypeName(dataType);
    if (__s == (char *)0x0) {
      std::ios::clear((int)str + (int)*(undefined8 *)(*(long *)str + -0x18));
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(str,__s,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(str,"(",1);
  }
  uVar4 = 0;
  local_34 = uVar2;
  do {
    if (uVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
    }
    if ((int)DVar1 < 0x1f) {
      if (DVar1 == TYPE_FLOAT) {
        local_40.value._0_4_ = *(undefined4 *)((long)varValue->value + uVar4 * 4);
        operator<<(str,(HexFloat *)&local_40);
      }
      else if (DVar1 == TYPE_INT) {
        std::ostream::operator<<(str,*(int *)((long)varValue->value + uVar4 * 4));
      }
    }
    else if (DVar1 == TYPE_UINT) {
      local_40.value = (deUint64)*(uint *)((long)varValue->value + uVar4 * 4);
      tcu::Format::Hex<8UL>::toStream(&local_40,str);
    }
    else if (DVar1 == TYPE_BOOL) {
      local_40.value._0_4_ = *(undefined4 *)((long)varValue->value + uVar4 * 4);
      operator<<(str,(HexBool *)&local_40);
    }
    uVar4 = uVar4 + 1;
  } while (uVar2 != uVar4);
  if (1 < (int)local_34) {
    std::__ostream_insert<char,std::char_traits<char>>(str,")",1);
  }
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const VarValue& varValue)
{
	DE_ASSERT(varValue.type.isBasicType());

	const glu::DataType		basicType		= varValue.type.getBasicType();
	const glu::DataType		scalarType		= glu::getDataTypeScalarType(basicType);
	const int				numComponents	= glu::getDataTypeScalarSize(basicType);

	if (numComponents > 1)
		str << glu::getDataTypeName(basicType) << "(";

	for (int compNdx = 0; compNdx < numComponents; compNdx++)
	{
		if (compNdx != 0)
			str << ", ";

		switch (scalarType)
		{
			case glu::TYPE_FLOAT:	str << HexFloat(((const float*)varValue.value)[compNdx]);			break;
			case glu::TYPE_INT:		str << ((const deInt32*)varValue.value)[compNdx];					break;
			case glu::TYPE_UINT:	str << tcu::toHex(((const deUint32*)varValue.value)[compNdx]);		break;
			case glu::TYPE_BOOL:	str << HexBool(((const deUint32*)varValue.value)[compNdx]);			break;

			default:
				DE_ASSERT(false);
		}
	}

	if (numComponents > 1)
		str << ")";

	return str;
}